

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall SceneRender::renderDevLook(SceneRender *this,Uniforms *_uniforms)

{
  pointer ppMVar1;
  ulong uVar2;
  
  ppMVar1 = (this->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppMVar1) {
    uVar2 = 0;
    do {
      if (ppMVar1[uVar2]->m_model_vbo != (Vbo *)0x0) {
        vera::Shader::use(&ppMVar1[uVar2]->mainShader);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])
                  (_uniforms,
                   &(this->m_devlook_spheres).
                    super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar2]->mainShader,1,1);
        vera::Model::render((this->m_devlook_spheres).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar2]);
      }
      uVar2 = uVar2 + 1;
      ppMVar1 = (this->m_devlook_spheres).
                super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->m_devlook_spheres).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3))
    ;
  }
  ppMVar1 = (this->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar1) {
    uVar2 = 0;
    do {
      if (ppMVar1[uVar2]->m_model_vbo != (Vbo *)0x0) {
        vera::Shader::use(&ppMVar1[uVar2]->mainShader);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])
                  (_uniforms,
                   &(this->m_devlook_billboards).
                    super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar2]->mainShader,1,1);
        vera::Model::render((this->m_devlook_billboards).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar2]);
      }
      uVar2 = uVar2 + 1;
      ppMVar1 = (this->m_devlook_billboards).
                super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->m_devlook_billboards).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3))
    ;
  }
  return;
}

Assistant:

void SceneRender::renderDevLook(Uniforms& _uniforms) {
    for (size_t i = 0; i < m_devlook_spheres.size(); i++) {
        if (m_devlook_spheres[i]->getVbo() == nullptr)
            continue;

        m_devlook_spheres[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_spheres[i]->getShader() );
        m_devlook_spheres[i]->render();
    }

    for (size_t i = 0; i < m_devlook_billboards.size(); i++) {
        if (m_devlook_billboards[i]->getVbo() == nullptr)
            continue;

        m_devlook_billboards[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_billboards[i]->getShader() );
        m_devlook_billboards[i]->render();
    }
}